

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpropertyanimation.cpp
# Opt level: O1

void __thiscall QPropertyAnimation::QPropertyAnimation(QPropertyAnimation *this,QObject *parent)

{
  QVariantAnimationPrivate *this_00;
  
  this_00 = (QVariantAnimationPrivate *)operator_new(0x188);
  QVariantAnimationPrivate::QVariantAnimationPrivate(this_00);
  (this_00->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData.
  _vptr_QObjectData = (_func_int **)&PTR__QPropertyAnimationPrivate_006aebc8;
  this_00[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.
  _vptr_QObjectData = (_func_int **)0x0;
  this_00[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.q_ptr =
       (QObject *)0xffffffff00000000;
  this_00[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.parent =
       (QObject *)0x0;
  this_00[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.children.d.d =
       (Data *)0x0;
  this_00[1].super_QAbstractAnimationPrivate.super_QObjectPrivate.super_QObjectData.children.d.ptr =
       (QObject **)0x0;
  QVariantAnimation::QVariantAnimation((QVariantAnimation *)this,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_006aebf8;
  return;
}

Assistant:

QPropertyAnimation::QPropertyAnimation(QObject *parent)
    : QVariantAnimation(*new QPropertyAnimationPrivate, parent)
{
}